

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O3

void AccessibleCompatible(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  
  if ((0xfffffffc < (doc->access).PRIORITYCHK - 4U) && (node->tag != (Dict *)0x0)) {
    TVar1 = node->tag->id;
    if ((int)TVar1 < 0x4c) {
      if (TVar1 == TidyTag_APPLET) {
        prvTidyReportAccessError(doc,node,0x2e9);
        return;
      }
      if (TVar1 == TidyTag_EMBED) {
        prvTidyReportAccessError(doc,node,0x2ea);
        return;
      }
    }
    else {
      if (TVar1 == TidyTag_SCRIPT) {
        prvTidyReportAccessError(doc,node,0x2e7);
        return;
      }
      if (TVar1 == TidyTag_OBJECT) {
        prvTidyReportAccessError(doc,node,0x2e8);
        return;
      }
    }
  }
  return;
}

Assistant:

static void AccessibleCompatible( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        int msgcode = 0;
        if ( nodeIsSCRIPT(node) )
            msgcode = ENSURE_PROGRAMMATIC_OBJECTS_ACCESSIBLE_SCRIPT;
        else if ( nodeIsOBJECT(node) )
            msgcode = ENSURE_PROGRAMMATIC_OBJECTS_ACCESSIBLE_OBJECT;
        else if ( nodeIsEMBED(node) )
            msgcode = ENSURE_PROGRAMMATIC_OBJECTS_ACCESSIBLE_EMBED;
        else if ( nodeIsAPPLET(node) )
            msgcode = ENSURE_PROGRAMMATIC_OBJECTS_ACCESSIBLE_APPLET;

        if ( msgcode )
            TY_(ReportAccessError)( doc, node, msgcode );
    }
}